

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O2

StringRef __thiscall llbuild::buildsystem::BuildKey::getFilteredDirectoryPath(BuildKey *this)

{
  pointer pcVar1;
  bool bVar2;
  StringRef SVar3;
  
  bVar2 = isFilteredDirectoryContents(this);
  if (!bVar2) {
    bVar2 = isDirectoryTreeStructureSignature(this);
    if (!bVar2) {
      __assert_fail("isFilteredDirectoryContents() || isDirectoryTreeStructureSignature()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                    ,0x101,
                    "StringRef llbuild::buildsystem::BuildKey::getFilteredDirectoryPath() const");
    }
  }
  pcVar1 = (this->key).key._M_dataplus._M_p;
  SVar3.Data = pcVar1 + 5;
  SVar3.Length._0_4_ = *(undefined4 *)(pcVar1 + 1);
  SVar3.Length._4_4_ = 0;
  return SVar3;
}

Assistant:

StringRef getFilteredDirectoryPath() const {
    assert(isFilteredDirectoryContents() || isDirectoryTreeStructureSignature());
    uint32_t nameSize;
    memcpy(&nameSize, &key.data()[1], sizeof(uint32_t));
    return StringRef(&key.data()[1 + sizeof(uint32_t)], nameSize);
  }